

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int autoIncBegin(Parse *pParse,int iDb,Table *pTab)

{
  int iVar1;
  bool bVar2;
  Parse *local_48;
  AutoincInfo *local_40;
  AutoincInfo *pInfo;
  Parse *pToplevel;
  int memId;
  Table *pTab_local;
  int iDb_local;
  Parse *pParse_local;
  
  pToplevel._4_4_ = 0;
  if ((pTab->tabFlags & 8) != 0) {
    local_48 = pParse;
    if (pParse->pToplevel != (Parse *)0x0) {
      local_48 = pParse->pToplevel;
    }
    local_40 = local_48->pAinc;
    while( true ) {
      bVar2 = false;
      if (local_40 != (AutoincInfo *)0x0) {
        bVar2 = local_40->pTab != pTab;
      }
      if (!bVar2) break;
      local_40 = local_40->pNext;
    }
    if (local_40 == (AutoincInfo *)0x0) {
      local_40 = (AutoincInfo *)sqlite3DbMallocRaw(pParse->db,0x18);
      if (local_40 == (AutoincInfo *)0x0) {
        return 0;
      }
      local_40->pNext = local_48->pAinc;
      local_48->pAinc = local_40;
      local_40->pTab = pTab;
      local_40->iDb = iDb;
      local_48->nMem = local_48->nMem + 1;
      iVar1 = local_48->nMem + 1;
      local_48->nMem = iVar1;
      local_40->regCtr = iVar1;
      local_48->nMem = local_48->nMem + 1;
    }
    pToplevel._4_4_ = local_40->regCtr;
  }
  return pToplevel._4_4_;
}

Assistant:

static int autoIncBegin(
  Parse *pParse,      /* Parsing context */
  int iDb,            /* Index of the database holding pTab */
  Table *pTab         /* The table we are writing to */
){
  int memId = 0;      /* Register holding maximum rowid */
  if( pTab->tabFlags & TF_Autoincrement ){
    Parse *pToplevel = sqlite3ParseToplevel(pParse);
    AutoincInfo *pInfo;

    pInfo = pToplevel->pAinc;
    while( pInfo && pInfo->pTab!=pTab ){ pInfo = pInfo->pNext; }
    if( pInfo==0 ){
      pInfo = sqlite3DbMallocRaw(pParse->db, sizeof(*pInfo));
      if( pInfo==0 ) return 0;
      pInfo->pNext = pToplevel->pAinc;
      pToplevel->pAinc = pInfo;
      pInfo->pTab = pTab;
      pInfo->iDb = iDb;
      pToplevel->nMem++;                  /* Register to hold name of table */
      pInfo->regCtr = ++pToplevel->nMem;  /* Max rowid register */
      pToplevel->nMem++;                  /* Rowid in sqlite_sequence */
    }
    memId = pInfo->regCtr;
  }
  return memId;
}